

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueTest.cpp
# Opt level: O1

TestType * __thiscall TestType::operator=(TestType *this,TestType *other)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  
  p_Var2 = &constructed._M_t._M_impl.super__Rb_tree_header._M_header;
  if (constructed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &constructed._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = constructed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (*(TestType **)(p_Var1 + 1) >= this) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(TestType **)(p_Var1 + 1) < this];
    } while (p_Var1 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)p_Var2 == &constructed._M_t._M_impl.super__Rb_tree_header) ||
     (this < *(TestType **)(p_Var2 + 1))) {
    __assert_fail("constructed.count(this) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x38,"TestType &TestType::operator=(TestType &&)");
  }
  p_Var2 = &constructed._M_t._M_impl.super__Rb_tree_header._M_header;
  if (constructed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &constructed._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = constructed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (*(TestType **)(p_Var1 + 1) >= other) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(TestType **)(p_Var1 + 1) < other];
    } while (p_Var1 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)p_Var2 != &constructed._M_t._M_impl.super__Rb_tree_header) &&
     (*(TestType **)(p_Var2 + 1) <= other)) {
    return this;
  }
  __assert_fail("constructed.count(&other) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                ,0x39,"TestType &TestType::operator=(TestType &&)");
}

Assistant:

TestType &operator=(TestType &&other) noexcept {
    assert(constructed.count(this) == 1);
    assert(constructed.count(&other) == 1);
    return *this;
  }